

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::CumulativeReporterBase::sectionEnded(CumulativeReporterBase *this,SectionStats *sectionStats)

{
  pointer *pppSVar1;
  SectionNode *pSVar2;
  size_t sVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  
  pSVar2 = (this->m_sectionStack).
           super__Vector_base<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1];
  std::__cxx11::string::_M_assign((string *)pSVar2);
  sVar3 = (sectionStats->sectionInfo).lineInfo.line;
  (pSVar2->stats).sectionInfo.lineInfo.file = (sectionStats->sectionInfo).lineInfo.file;
  (pSVar2->stats).sectionInfo.lineInfo.line = sVar3;
  uVar4 = (sectionStats->assertions).failed;
  uVar5 = (sectionStats->assertions).failedButOk;
  uVar6 = (sectionStats->assertions).skipped;
  uVar7 = *(undefined8 *)((long)&(sectionStats->assertions).skipped + 1);
  uVar8 = *(undefined8 *)((long)&sectionStats->durationInSeconds + 1);
  (pSVar2->stats).assertions.passed = (sectionStats->assertions).passed;
  (pSVar2->stats).assertions.failed = uVar4;
  (pSVar2->stats).assertions.failedButOk = uVar5;
  (pSVar2->stats).assertions.skipped = uVar6;
  *(undefined8 *)((long)&(pSVar2->stats).assertions.skipped + 1) = uVar7;
  *(undefined8 *)((long)&(pSVar2->stats).durationInSeconds + 1) = uVar8;
  pppSVar1 = &(this->m_sectionStack).
              super__Vector_base<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  *pppSVar1 = *pppSVar1 + -1;
  return;
}

Assistant:

void CumulativeReporterBase::sectionEnded( SectionStats const& sectionStats ) {
        assert( !m_sectionStack.empty() );
        SectionNode& node = *m_sectionStack.back();
        node.stats = sectionStats;
        m_sectionStack.pop_back();
    }